

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O2

uint tinf_adler32(void *data,uint length)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  
  uVar2 = 0;
  uVar19 = 1;
  for (; length != 0; length = length - (uint)uVar20) {
    uVar20 = 0x15b0;
    if (length < 0x15b0) {
      uVar20 = (ulong)length;
    }
    uVar1 = uVar20 >> 4;
    while (iVar3 = (int)uVar1, uVar1 = (ulong)(iVar3 - 1), iVar3 != 0) {
      iVar12 = uVar19 + *data;
      iVar3 = (uint)*(byte *)((long)data + 1) + iVar12;
      iVar13 = (uint)*(byte *)((long)data + 2) + iVar3;
      iVar4 = (uint)*(byte *)((long)data + 3) + iVar13;
      iVar14 = (uint)*(byte *)((long)data + 4) + iVar4;
      iVar5 = (uint)*(byte *)((long)data + 5) + iVar14;
      iVar15 = (uint)*(byte *)((long)data + 6) + iVar5;
      iVar6 = (uint)*(byte *)((long)data + 7) + iVar15;
      iVar16 = (uint)*(byte *)((long)data + 8) + iVar6;
      iVar7 = (uint)*(byte *)((long)data + 9) + iVar16;
      iVar17 = (uint)*(byte *)((long)data + 10) + iVar7;
      iVar8 = (uint)*(byte *)((long)data + 0xb) + iVar17;
      iVar18 = (uint)*(byte *)((long)data + 0xc) + iVar8;
      iVar9 = (uint)*(byte *)((long)data + 0xd) + iVar18;
      iVar10 = (uint)*(byte *)((long)data + 0xe) + iVar9;
      uVar19 = (uint)*(byte *)((long)data + 0xf) + iVar10;
      uVar2 = uVar2 + iVar12 + iVar3 + iVar13 + iVar4 + iVar14 + iVar5 + iVar15 + iVar6 + iVar16 +
              iVar7 + iVar17 + iVar8 + iVar18 + iVar9 + iVar10 + uVar19;
      data = (void *)((long)data + 0x10);
    }
    for (lVar11 = 0; ((uint)uVar20 & 0xf) != (uint)lVar11; lVar11 = lVar11 + 1) {
      uVar19 = uVar19 + *(byte *)((long)data + lVar11);
      uVar2 = uVar2 + uVar19;
    }
    uVar19 = uVar19 % 0xfff1;
    uVar2 = uVar2 % 0xfff1;
    data = (void *)((long)data + lVar11);
  }
  return uVar2 << 0x10 | uVar19;
}

Assistant:

unsigned int tinf_adler32(const void *data, unsigned int length)
{
	const unsigned char *buf = (const unsigned char *) data;

	unsigned int s1 = 1;
	unsigned int s2 = 0;

	while (length > 0) {
		int k = length < A32_NMAX ? length : A32_NMAX;
		int i;

		for (i = k / 16; i; --i, buf += 16) {
			s1 += buf[0];
			s2 += s1;
			s1 += buf[1];
			s2 += s1;
			s1 += buf[2];
			s2 += s1;
			s1 += buf[3];
			s2 += s1;
			s1 += buf[4];
			s2 += s1;
			s1 += buf[5];
			s2 += s1;
			s1 += buf[6];
			s2 += s1;
			s1 += buf[7];
			s2 += s1;

			s1 += buf[8];
			s2 += s1;
			s1 += buf[9];
			s2 += s1;
			s1 += buf[10];
			s2 += s1;
			s1 += buf[11];
			s2 += s1;
			s1 += buf[12];
			s2 += s1;
			s1 += buf[13];
			s2 += s1;
			s1 += buf[14];
			s2 += s1;
			s1 += buf[15];
			s2 += s1;
		}

		for (i = k % 16; i; --i) {
			s1 += *buf++;
			s2 += s1;
		}

		s1 %= A32_BASE;
		s2 %= A32_BASE;

		length -= k;
	}

	return (s2 << 16) | s1;
}